

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O0

void __thiscall Prog::draw_bitmap(Prog *this,string *str,string *how,bool memory,bool destination)

{
  bool bVar1;
  byte bVar2;
  byte in_CL;
  allocator<char> *in_RSI;
  long in_RDI;
  byte in_R8B;
  undefined8 in_XMM3_Qa;
  undefined4 uVar3;
  ALLEGRO_COLOR AVar4;
  float s;
  int h;
  int w;
  ALLEGRO_BITMAP *bmp;
  ALLEGRO_COLOR color;
  int av;
  int bv;
  int gv;
  int rv;
  int i;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  int in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  allocator<char> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  ALLEGRO_BITMAP *local_1b8;
  ALLEGRO_BITMAP *local_1b0;
  allocator<char> local_169;
  string local_168 [32];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  allocator<char> local_119;
  string local_118 [32];
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e4;
  int local_e0;
  int local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  allocator<char> local_b9;
  string local_b8 [32];
  undefined8 local_98;
  undefined8 uStack_90;
  allocator<char> local_69;
  string local_68 [32];
  ALLEGRO_BITMAP *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  uint local_20;
  byte local_1a;
  byte local_19;
  allocator<char> *local_10;
  
  uVar3 = (undefined4)((ulong)in_XMM3_Qa >> 0x20);
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_20 = (uint)local_1a;
  local_10 = in_RSI;
  local_24 = HSlider::get_cur_value((HSlider *)(in_RDI + 0x860 + (long)(int)local_20 * 0x40));
  local_28 = HSlider::get_cur_value((HSlider *)(in_RDI + 0x920 + (long)(int)local_20 * 0x40));
  local_2c = HSlider::get_cur_value((HSlider *)(in_RDI + 0x9e0 + (long)(int)local_20 * 0x40));
  local_30 = HSlider::get_cur_value((HSlider *)(in_RDI + 0xaa0 + (long)(int)local_20 * 0x40));
  AVar4 = makecol(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                  in_stack_fffffffffffffdf8);
  uStack_38 = AVar4._8_8_;
  local_40 = AVar4._0_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28
             ,in_stack_fffffffffffffe20);
  bVar1 = contains((string *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   (string *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  if (bVar1) {
    if ((local_19 & 1) == 0) {
      local_1b0 = mysha;
    }
    else {
      local_1b0 = mysha_bmp;
    }
    local_48 = local_1b0;
  }
  else {
    if ((local_19 & 1) == 0) {
      local_1b8 = allegro;
    }
    else {
      local_1b8 = allegro_bmp;
    }
    local_48 = local_1b8;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                          (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  if (bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    if (bVar1) {
      local_98 = local_40;
      uStack_90 = uStack_38;
      al_draw_filled_rectangle(0,0,0x43a00000,0x43480000,local_40,uStack_38);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      bVar2 = contains((string *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                       (string *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator(&local_b9);
      if ((bVar2 & 1) == 0) {
        al_draw_bitmap(0,local_48,0);
      }
      else {
        local_d8 = local_40;
        uStack_d0 = uStack_38;
        al_draw_tinted_bitmap((int)local_40,uStack_38,0,local_48,0);
      }
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    if (bVar1) {
      local_dc = al_get_bitmap_width(local_48);
      local_e0 = al_get_bitmap_height(local_48);
      local_e4 = (200.0 / (float)local_e0) * 0.9;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                              (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
      ;
      if (bVar1) {
        local_f8 = local_40;
        uStack_f0 = uStack_38;
        al_draw_filled_rectangle(0x41200000,0x41200000,0x43960000,0x43340000,local_40,uStack_38);
      }
      else {
        __s = &local_119;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),(char *)__s,
                   local_10);
        bVar1 = contains((string *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                         (string *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator(&local_119);
        if (bVar1) {
          local_138 = local_40;
          uStack_130 = uStack_38;
          al_draw_tinted_scaled_bitmap((int)local_40,uStack_38,0,local_48,0);
        }
        else {
          al_draw_scaled_bitmap
                    (0,0,(float)local_dc,CONCAT44(uVar3,(float)local_e0),
                     160.0 - ((float)local_dc * local_e4) / 2.0,
                     100.0 - ((float)local_e0 * local_e4) / 2.0,(float)local_dc * local_e4,
                     (float)local_e0 * local_e4,local_48,0);
        }
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                              (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
      ;
      if (bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                                (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8
                                                ));
        if (bVar1) {
          local_148 = local_40;
          uStack_140 = uStack_38;
          al_draw_filled_circle(0x43200000,0x42c80000,0x42c80000,local_40,uStack_38);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
          bVar2 = contains((string *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                           (string *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          std::__cxx11::string::~string(local_168);
          std::allocator<char>::~allocator(&local_169);
          if ((bVar2 & 1) == 0) {
            al_draw_rotated_bitmap
                      (0x43200000,0x42c80000,0x43200000,0x42c80000,0x3ec90fdb,local_48,0);
          }
          else {
            al_draw_tinted_rotated_bitmap
                      ((int)local_40,uStack_38,0x43200000,0x42c80000,0x43200000,0x42c80000,
                       0x3ec90fdb,local_48,0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Prog::draw_bitmap(const std::string & str,
   const std::string &how,
   bool memory,
   bool destination)
{
   int i = destination ? 1 : 0;
   int rv = r[i].get_cur_value();
   int gv = g[i].get_cur_value();
   int bv = b[i].get_cur_value();
   int av = a[i].get_cur_value();
   ALLEGRO_COLOR color = makecol(rv, gv, bv, av);
   ALLEGRO_BITMAP *bmp;

   if (contains(str, "Mysha"))
      bmp = (memory ? mysha_bmp : mysha);
   else
      bmp = (memory ? allegro_bmp : allegro);

   if (how == "original") {
      if (str == "Color")
         al_draw_filled_rectangle(0, 0, 320, 200, color);
      else if (contains(str, "tint"))
         al_draw_tinted_bitmap(bmp, color, 0, 0, 0);
      else
         al_draw_bitmap(bmp, 0, 0, 0);
   }
   else if (how == "scaled") {
      int w = al_get_bitmap_width(bmp);
      int h = al_get_bitmap_height(bmp);
      float s = 200.0 / h * 0.9;
      if (str == "Color") {
         al_draw_filled_rectangle(10, 10, 300, 180, color);
      }
      else if (contains(str, "tint")) {
         al_draw_tinted_scaled_bitmap(bmp, color, 0, 0, w, h,
            160 - w * s / 2, 100 - h * s / 2, w * s, h * s, 0);
      }
      else {
         al_draw_scaled_bitmap(bmp, 0, 0, w, h,
            160 - w * s / 2, 100 - h * s / 2, w * s, h * s, 0);
      }
   }
   else if (how == "rotated") {
      if (str == "Color") {
         al_draw_filled_circle(160, 100, 100, color);
      }
      else if (contains(str, "tint")) {
         al_draw_tinted_rotated_bitmap(bmp, color, 160, 100,
            160, 100, ALLEGRO_PI / 8, 0);
      }
      else {
         al_draw_rotated_bitmap(bmp, 160, 100,
            160, 100, ALLEGRO_PI / 8, 0);
      }
   }
}